

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

bool Fossilize::write_buffer_to_file(char *path,void *data,size_t size)

{
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    sVar1 = fwrite(data,1,size,__s);
    bVar2 = sVar1 == size;
    fclose(__s);
  }
  return bVar2;
}

Assistant:

bool write_buffer_to_file(const char *path, const void *data, size_t size)
{
	FILE *file = fopen(path, "wb");
	if (!file)
		return false;

	if (fwrite(data, 1, size, file) != size)
	{
		fclose(file);
		return false;
	}

	fclose(file);
	return true;
}